

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetri.cpp
# Opt level: O1

PlaneTriResult
planeTriIntersection
          (float *plane,float *triangle,uint tstride,float epsilon,float *front,uint *fcount,
          float *back,uint *bcount)

{
  float *p2;
  float *p2_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  uint *puVar15;
  ulong uVar16;
  float *pfVar17;
  float split [3];
  float local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  uint *local_38;
  
  *fcount = 0;
  *bcount = 0;
  uVar14 = (ulong)tstride;
  p2 = (float *)((long)triangle + uVar14);
  uVar16 = (ulong)(tstride * 2);
  p2_00 = (float *)((long)triangle + uVar16);
  fVar1 = *plane;
  fVar2 = plane[1];
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * triangle[1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)*triangle));
  fVar3 = plane[2];
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar3),ZEXT416((uint)triangle[2]));
  fVar4 = plane[3];
  fVar5 = fVar4 + auVar9._0_4_ + epsilon;
  bVar10 = fVar5 <= 0.0;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * *(float *)((long)triangle + uVar14 + 4))),
                           ZEXT416((uint)fVar1),ZEXT416(*(uint *)((long)triangle + uVar14)));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar3),
                           ZEXT416(*(uint *)((long)triangle + uVar14 + 8)));
  fVar6 = fVar4 + auVar9._0_4_ + epsilon;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * *(float *)((long)triangle + uVar16 + 4))),
                           ZEXT416((uint)fVar1),ZEXT416(*(uint *)((long)triangle + uVar16)));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar3),
                           ZEXT416(*(uint *)((long)triangle + uVar16 + 8)));
  fVar1 = fVar4 + auVar9._0_4_ + epsilon;
  bVar11 = fVar6 <= 0.0 == bVar10;
  bVar12 = fVar1 <= 0.0 == bVar10;
  local_58 = ZEXT416((uint)fVar1);
  if ((bVar11) && (bVar12)) {
    if (0.0 < fVar5) {
      add(triangle,front,tstride,fcount);
      add(p2,front,tstride,fcount);
      bcount = fcount;
      back = front;
    }
    else {
      add(triangle,back,tstride,bcount);
      add(p2,back,tstride,bcount);
    }
    add(p2_00,back,tstride,bcount);
    return (uint)bVar10;
  }
  local_48 = ZEXT416((uint)fVar6);
  puVar15 = bcount;
  pfVar17 = front;
  if (bVar11) {
    if (0.0 < fVar5) {
      add(triangle,front,tstride,fcount);
      puVar15 = fcount;
    }
    else {
      add(triangle,back,tstride,bcount);
      pfVar17 = back;
    }
  }
  else {
    intersect(triangle,p2,&local_64,plane);
    if (0.0 < fVar5) {
      add(triangle,front,tstride,fcount);
      uVar13 = *fcount;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)front + uVar14) = local_64;
      *(undefined4 *)((long)front + uVar14 + 4) = local_60;
      *(undefined4 *)((long)front + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *fcount = uVar13;
      if (4 < uVar13) goto LAB_00938c3a;
      uVar13 = *bcount;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)back + uVar14) = local_64;
      *(undefined4 *)((long)back + uVar14 + 4) = local_60;
      *(undefined4 *)((long)back + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *bcount = uVar13;
      pfVar17 = back;
    }
    else {
      local_38 = fcount;
      add(triangle,back,tstride,bcount);
      uVar13 = *bcount;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)back + uVar14) = local_64;
      *(undefined4 *)((long)back + uVar14 + 4) = local_60;
      *(undefined4 *)((long)back + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *bcount = uVar13;
      if (4 < uVar13) goto LAB_00938c3a;
      uVar13 = *local_38;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)front + uVar14) = local_64;
      *(undefined4 *)((long)front + uVar14 + 4) = local_60;
      *(undefined4 *)((long)front + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *local_38 = uVar13;
      fcount = local_38;
      puVar15 = local_38;
    }
    if (4 < uVar13) goto LAB_00938c3a;
  }
  add(p2,pfVar17,tstride,puVar15);
  uVar7 = vcmpps_avx512vl(ZEXT816(0) << 0x40,local_58,5);
  uVar8 = vcmpps_avx512vl(ZEXT816(0) << 0x40,local_48,5);
  puVar15 = bcount;
  pfVar17 = back;
  if ((((ushort)uVar8 ^ (ushort)uVar7) & 1) == 0) {
    if (0.0 < local_58._0_4_) goto LAB_00938b82;
  }
  else {
    intersect(p2,p2_00,&local_64,plane);
    uVar14 = (ulong)(*fcount * tstride);
    uVar13 = *fcount + 1;
    *(float *)((long)front + uVar14) = local_64;
    *(undefined4 *)((long)front + uVar14 + 4) = local_60;
    *(undefined4 *)((long)front + uVar14 + 8) = local_5c;
    *fcount = uVar13;
    if (0.0 < (float)local_58._0_4_) {
      if (4 < uVar13) goto LAB_00938c3a;
      uVar13 = *bcount;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)back + uVar14) = local_64;
      *(undefined4 *)((long)back + uVar14 + 4) = local_60;
      *(undefined4 *)((long)back + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *bcount = uVar13;
      if (4 < uVar13) goto LAB_00938c3a;
LAB_00938b82:
      puVar15 = fcount;
      pfVar17 = front;
    }
    else {
      if (4 < uVar13) goto LAB_00938c3a;
      uVar13 = *bcount;
      uVar14 = (ulong)(uVar13 * tstride);
      *(float *)((long)back + uVar14) = local_64;
      *(undefined4 *)((long)back + uVar14 + 4) = local_60;
      *(undefined4 *)((long)back + uVar14 + 8) = local_5c;
      uVar13 = uVar13 + 1;
      *bcount = uVar13;
      if (4 < uVar13) goto LAB_00938c3a;
    }
  }
  add(p2_00,pfVar17,tstride,puVar15);
  if (bVar12) {
    return PTR_SPLIT;
  }
  intersect(p2_00,triangle,&local_64,plane);
  uVar14 = (ulong)(*fcount * tstride);
  uVar13 = *fcount + 1;
  *(float *)((long)front + uVar14) = local_64;
  *(undefined4 *)((long)front + uVar14 + 4) = local_60;
  *(undefined4 *)((long)front + uVar14 + 8) = local_5c;
  *fcount = uVar13;
  if (uVar13 < 5) {
    uVar13 = *bcount;
    uVar14 = (ulong)(tstride * uVar13);
    *(float *)((long)back + uVar14) = local_64;
    *(undefined4 *)((long)back + uVar14 + 4) = local_60;
    *(undefined4 *)((long)back + uVar14 + 8) = local_5c;
    uVar13 = uVar13 + 1;
    *bcount = uVar13;
    if (uVar13 < 5) {
      return PTR_SPLIT;
    }
  }
LAB_00938c3a:
  __assert_fail("pcount <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/planetri.cpp"
                ,0x49,"void add(const float *, float *, unsigned int, unsigned int &)");
}

Assistant:

PlaneTriResult planeTriIntersection(const float *plane,    // the plane equation in Ax+By+Cz+D format
                                    const float *triangle, // the source triangle.
                                    unsigned int tstride,  // stride in bytes of the input and output triangles
                                    float        epsilon,  // the co-planer epsilon value.
                                    float       *front,    // the triangle in front of the
                                    unsigned int &fcount,  // number of vertices in the 'front' triangle
                                    float       *back,     // the triangle in back of the plane
                                    unsigned int &bcount) // the number of vertices in the 'back' triangle.
{
  fcount = 0;
  bcount = 0;

  const char *tsource = (const char *) triangle;

  // get the three vertices of the triangle.
  const float *p1     = (const float *) (tsource);
  const float *p2     = (const float *) (tsource+tstride);
  const float *p3     = (const float *) (tsource+tstride*2);


  PlaneTriResult r1   = getSidePlane(p1,plane,epsilon); // compute the side of the plane each vertex is on
  PlaneTriResult r2   = getSidePlane(p2,plane,epsilon);
  PlaneTriResult r3   = getSidePlane(p3,plane,epsilon);

  if ( r1 == r2 && r1 == r3 ) // if all three vertices are on the same side of the plane.
  {
    if ( r1 == PTR_FRONT ) // if all three are in front of the plane, then copy to the 'front' output triangle.
    {
      add(p1,front,tstride,fcount);
      add(p2,front,tstride,fcount);
      add(p3,front,tstride,fcount);
    }
    else
    {
      add(p1,back,tstride,bcount); // if all three are in 'abck' then copy to the 'back' output triangle.
      add(p2,back,tstride,bcount);
      add(p3,back,tstride,bcount);
    }
    return r1; // if all three points are on the same side of the plane return result
  }

  // ok.. we need to split the triangle at the plane.

  // First test ray segment P1 to P2
  if ( r1 == r2 ) // if these are both on the same side...
  {
    if ( r1 == PTR_FRONT )
    {
      add( p1, front, tstride, fcount );
      add( p2, front, tstride, fcount );
    }
    else
    {
      add( p1, back, tstride, bcount );
      add( p2, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p1,p2,split,plane);

    if ( r1 == PTR_FRONT )
    {

      add(p1, front, tstride, fcount );
      add(split, front, tstride, fcount );

      add(split, back, tstride, bcount );
      add(p2, back, tstride, bcount );

    }
    else
    {
      add(p1, back, tstride, bcount );
      add(split, back, tstride, bcount );

      add(split, front, tstride, fcount );
      add(p2, front, tstride, fcount );
    }

  }

  // Next test ray segment P2 to P3
  if ( r2 == r3 ) // if these are both on the same side...
  {
    if ( r3 == PTR_FRONT )
    {
      add( p3, front, tstride, fcount );
    }
    else
    {
      add( p3, back, tstride, bcount );
    }
  }
  else
  {
    float split[3]; // split the point
    intersect(p2,p3,split,plane);

    if ( r3 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, front, tstride, fcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );

      add(p3, back, tstride, bcount );
    }
  }

  // Next test ray segment P3 to P1
  if ( r3 != r1 ) // if these are both on the same side...
  {
    float split[3]; // split the point

    intersect(p3,p1,split,plane);

    if ( r1 == PTR_FRONT )
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
    else
    {
      add(split, front, tstride, fcount );
      add(split, back, tstride, bcount );
    }
  }



  return PTR_SPLIT;
}